

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

bool __thiscall cmFileCopier::InstallSymlink(cmFileCopier *this,string *fromFile,string *toFile)

{
  char *pcVar1;
  cmCommand *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  string symlinkTarget;
  ostringstream e;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  bVar3 = cmsys::SystemTools::ReadSymlink(fromFile,&local_1c8);
  if (bVar3) {
    bVar3 = true;
    if (this->Always == false) {
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = local_1a8 + 0x10;
      bVar4 = cmsys::SystemTools::ReadSymlink(toFile,(string *)local_1a8);
      bVar3 = true;
      if ((bVar4) && (local_1c8._M_string_length == local_1a8._8_8_)) {
        if (local_1c8._M_string_length == 0) {
          bVar3 = false;
        }
        else {
          iVar5 = bcmp(local_1c8._M_dataplus._M_p,(void *)local_1a8._0_8_,local_1c8._M_string_length
                      );
          bVar3 = iVar5 != 0;
        }
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
    }
    (*this->_vptr_cmFileCopier[4])(this,toFile,2,(ulong)bVar3);
    bVar4 = true;
    if (bVar3 == false) goto LAB_002a6744;
    cmsys::SystemTools::RemoveFile(toFile);
    cmsys::SystemTools::GetFilenamePath((string *)local_1a8,toFile);
    cmsys::SystemTools::MakeDirectory((string *)local_1a8,(mode_t *)0x0);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    bVar3 = cmSystemTools::CreateSymlink(&local_1c8,toFile,(string *)0x0);
    if (bVar3) goto LAB_002a6744;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar1 = this->Name;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)&local_1e8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x40);
    }
    else {
      sVar6 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," cannot duplicate symlink \"",0x1b);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(fromFile->_M_dataplus)._M_p,fromFile->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" at \"",6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(toFile->_M_dataplus)._M_p,toFile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    pcVar2 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(pcVar2,&local_1e8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar1 = this->Name;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)&local_1e8 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x40);
    }
    else {
      sVar6 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," cannot read symlink \"",0x16);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(fromFile->_M_dataplus)._M_p,fromFile->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" to duplicate at \"",0x13);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(toFile->_M_dataplus)._M_p,toFile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    pcVar2 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(pcVar2,&local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  bVar4 = false;
LAB_002a6744:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool cmFileCopier::InstallSymlink(const std::string& fromFile,
                                  const std::string& toFile)
{
  // Read the original symlink.
  std::string symlinkTarget;
  if (!cmSystemTools::ReadSymlink(fromFile, symlinkTarget)) {
    std::ostringstream e;
    e << this->Name << " cannot read symlink \"" << fromFile
      << "\" to duplicate at \"" << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if (!this->Always) {
    std::string oldSymlinkTarget;
    if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
      if (symlinkTarget == oldSymlinkTarget) {
        copy = false;
      }
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if (copy) {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create destination directory if it doesn't exist
    cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(toFile));

    // Create the symlink.
    if (!cmSystemTools::CreateSymlink(symlinkTarget, toFile)) {
      std::ostringstream e;
      e << this->Name << " cannot duplicate symlink \"" << fromFile
        << "\" at \"" << toFile << "\".";
      this->FileCommand->SetError(e.str());
      return false;
    }
  }

  return true;
}